

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 local_80 [8];
  mbedtls_mpi B;
  undefined1 local_50 [8];
  mbedtls_mpi T;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  T.p._0_4_ = 1;
  local_50 = (undefined1  [8])0x0;
  cVar1 = *s;
  if (cVar1 == '\0') {
    mbedtls_mpi_free(X);
    return 0;
  }
  T._8_8_ = strlen(s + (cVar1 == '-'));
  if (radix == 0x10) {
    if ((ulong)T._8_8_ >> 0x3e != 0) {
      return -4;
    }
    iVar3 = mbedtls_mpi_grow(X,(((ulong)T._8_8_ >> 4) + 1) - (ulong)((T._8_8_ & 0xf) == 0));
    if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_grow(X,1), iVar3 != 0)) goto LAB_00217c03;
    memset(X->p,0,(ulong)X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (T._8_8_ != 0) {
      pcVar4 = s + (cVar1 == '-');
      bVar6 = 0;
      uVar7 = 0;
      do {
        pcVar4 = pcVar4 + -1;
        cVar2 = pcVar4[T._8_8_];
        iVar3 = (int)cVar2;
        uVar9 = (ulong)(iVar3 - 0x30);
        if (9 < (byte)(cVar2 - 0x30U)) {
          uVar9 = 0xff;
        }
        uVar10 = (ulong)(iVar3 - 0x37);
        if (5 < (byte)(cVar2 + 0xbfU)) {
          uVar10 = uVar9;
        }
        uVar9 = (ulong)(iVar3 - 0x57);
        if (5 < (byte)(cVar2 + 0x9fU)) {
          uVar9 = uVar10;
        }
        if (0xf < uVar9) goto LAB_00217d4c;
        X->p[uVar7 >> 4] = X->p[uVar7 >> 4] | uVar9 << (bVar6 & 0x3c);
        uVar7 = uVar7 + 1;
        bVar6 = bVar6 + 4;
      } while (T._8_8_ != uVar7);
    }
  }
  else {
    iVar3 = mbedtls_mpi_grow(X,1);
    if (iVar3 != 0) goto LAB_00217c03;
    memset(X->p,0,(ulong)X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (T._8_8_ != 0) {
      lVar8 = 0;
      do {
        cVar2 = (s + (cVar1 == '-'))[lVar8];
        iVar3 = (int)cVar2;
        uVar7 = (ulong)(iVar3 - 0x30);
        if (9 < (byte)(cVar2 - 0x30U)) {
          uVar7 = 0xff;
        }
        uVar9 = (ulong)(iVar3 - 0x37);
        if (5 < (byte)(cVar2 + 0xbfU)) {
          uVar9 = uVar7;
        }
        uVar7 = (ulong)(iVar3 - 0x57);
        if (5 < (byte)(cVar2 + 0x9fU)) {
          uVar7 = uVar9;
        }
        if ((uint)radix <= uVar7) goto LAB_00217d4c;
        iVar3 = mbedtls_mpi_mul_int((mbedtls_mpi *)local_50,X,(ulong)(uint)radix);
        if (iVar3 != 0) goto LAB_00217c03;
        B.p._0_4_ = 0x10001;
        local_80 = (undefined1  [8])&B.s;
        B._8_8_ = uVar7;
        iVar3 = add_sub_mpi(X,(mbedtls_mpi *)local_50,(mbedtls_mpi *)local_80,1);
        if (iVar3 != 0) goto LAB_00217c03;
        lVar8 = lVar8 + 1;
      } while (T._8_8_ != lVar8);
    }
  }
  iVar3 = 0;
  if ((cVar1 == '-') && (sVar5 = mbedtls_mpi_core_bitlen(X->p,(ulong)X->n), sVar5 != 0)) {
    X->s = -1;
  }
LAB_00217c03:
  if (local_50 != (undefined1  [8])0x0) {
    mbedtls_zeroize_and_free((void *)local_50,(ulong)T.p._2_2_ << 3);
  }
  return iVar3;
LAB_00217d4c:
  iVar3 = -6;
  goto LAB_00217c03;
}

Assistant:

int mbedtls_mpi_read_string(mbedtls_mpi *X, int radix, const char *s)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    int sign = 1;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(s != NULL);

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

    if (s[0] == 0) {
        mbedtls_mpi_free(X);
        return 0;
    }

    if (s[0] == '-') {
        ++s;
        sign = -1;
    }

    slen = strlen(s);

    if (radix == 16) {
        if (slen > SIZE_MAX >> 2) {
            return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        }

        n = BITS_TO_LIMBS(slen << 2);

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = slen, j = 0; i > 0; i--, j++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i - 1]));
            X->p[j / (2 * ciL)] |= d << ((j % (2 * ciL)) << 2);
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = 0; i < slen; i++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i]));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T, X, radix));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(X, &T, d));
        }
    }

    if (sign < 0 && mbedtls_mpi_bitlen(X) != 0) {
        X->s = -1;
    }

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}